

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libspirv.cpp
# Opt level: O2

void __thiscall spvtools::Context::SetMessageConsumer(Context *this,MessageConsumer *consumer)

{
  spv_context context;
  _Manager_type p_Var1;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  context = this->context_;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  local_10 = consumer->_M_invoker;
  p_Var1 = (consumer->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(consumer->super__Function_base)._M_functor;
    local_28._8_8_ = *(undefined8 *)((long)&(consumer->super__Function_base)._M_functor + 8);
    (consumer->super__Function_base)._M_manager = (_Manager_type)0x0;
    consumer->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var1;
  }
  SetContextMessageConsumer(context,(MessageConsumer *)&local_28);
  if (local_18 != (_Manager_type)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void Context::SetMessageConsumer(MessageConsumer consumer) {
  SetContextMessageConsumer(context_, std::move(consumer));
}